

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O3

void __thiscall QPDFParser::addScalar<QPDF_Bool,bool>(QPDFParser *this,bool *args)

{
  bool bVar1;
  StackFrame *pSVar2;
  QPDF *pQVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  qpdf_offset_t qVar6;
  shared_ptr<QPDFObject> obj;
  shared_ptr<QPDFObject> local_38;
  
  if ((this->bad_count == 0) ||
     ((pSVar2 = this->frame,
      (ulong)((long)(pSVar2->olist).
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(pSVar2->olist).
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                   super__Vector_impl_data._M_start) < 0x13881 &&
      ((pSVar2->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x1389)))) {
    bVar1 = *args;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaf0;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var5 + 1);
    *(bool *)&p_Var5[1]._vptr__Sp_counted_base = bVar1;
    *(undefined1 *)&p_Var5[4]._vptr__Sp_counted_base = 3;
    p_Var5[4]._M_use_count = 0;
    p_Var5[4]._M_weak_count = 0;
    p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[5]._M_use_count = 0;
    p_Var5[5]._M_weak_count = 0;
    p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[6]._M_use_count = -1;
    p_Var5[6]._M_weak_count = -1;
    pQVar3 = this->context;
    local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var5;
    qVar6 = InputSource::getLastOffset(this->input);
    *(QPDF **)&p_Var5[5]._M_use_count = pQVar3;
    *(element_type **)&p_Var5[4]._M_use_count =
         (this->description).
         super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var5 + 5),
               &(this->description).
                super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    lVar4._0_4_ = p_Var5[6]._M_use_count;
    lVar4._4_4_ = p_Var5[6]._M_weak_count;
    if (lVar4 < 0) {
      p_Var5[6]._M_use_count = (int)qVar6;
      p_Var5[6]._M_weak_count = (int)((ulong)qVar6 >> 0x20);
    }
    add(this,&local_38);
    if (local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  else {
    this->max_bad_count = 0;
  }
  return;
}

Assistant:

void
QPDFParser::addScalar(Args&&... args)
{
    if (bad_count && (frame->olist.size() > 5'000 || frame->dict.size() > 5'000)) {
        // Stop adding scalars. We are going to abort when the close token or a bad token is
        // encountered.
        max_bad_count = 0;
        return;
    }
    auto obj = QPDFObject::create<T>(std::forward<Args>(args)...);
    obj->setDescription(context, description, input.getLastOffset());
    add(std::move(obj));
}